

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * compatibilityAgree_abi_cxx11_
                   (string *__return_storage_ptr__,CompatibleType t,bool dominant)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (t - NumberMinType < 2) {
    pcVar2 = "(Ignored)\n";
    if (dominant) {
      pcVar2 = "(Dominant)\n";
    }
    paVar1 = &local_a;
  }
  else {
    if (StringType < t) {
      __assert_fail("0 && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                    ,0x1018,"std::string compatibilityAgree(CompatibleType, bool)");
    }
    pcVar2 = "(Agree)\n";
    if (dominant) {
      pcVar2 = "(Disagree)\n";
    }
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityAgree(CompatibleType t, bool dominant)
{
  switch(t)
    {
    case BoolType:
    case StringType:
      return dominant ? "(Disagree)\n" : "(Agree)\n";
    case NumberMaxType:
    case NumberMinType:
      return dominant ? "(Dominant)\n" : "(Ignored)\n";
    }
  assert(0 && "Unreachable!");
  return "";
}